

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O2

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator+=(LE_EulerAngles *this,LE_EulerAngles *Value)

{
  KFIXED<char,_(unsigned_char)__x03_> KStack_b8;
  KFIXED<char,_(unsigned_char)__x03_> local_a8;
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  DataTypeBase local_88;
  char local_80;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  DataTypeBase local_68;
  char local_60;
  KFIXED<char,_(unsigned_char)__x03_> local_58;
  DataTypeBase local_48;
  char local_40;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  
  local_48._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00325e98;
  local_40 = (Value->m_Psi).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_98,&this->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_38,&this->m_Psi);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_98.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_48);
  local_68._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00325e98;
  local_60 = (Value->m_Theta).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_a8,&this->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_58,&this->m_Theta);
  DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_a8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_68);
  local_88._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00325e98;
  local_80 = (Value->m_Phi).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&KStack_b8,&this->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_78,&this->m_Phi);
  DataTypeBase::~DataTypeBase(&local_78.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&KStack_b8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_88);
  return this;
}

Assistant:

LE_EulerAngles & LE_EulerAngles::operator += ( const LE_EulerAngles & Value )
{
    m_Psi   = m_Psi + Value.m_Psi;
    m_Theta = m_Theta + Value.m_Theta;
    m_Phi   = m_Phi + Value.m_Phi;
    return *this;
}